

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O2

bool efsw::FileInfo::isLink(string *filePath)

{
  FileInfo fi;
  
  FileInfo(&fi,filePath,true);
  std::__cxx11::string::~string((string *)&fi);
  return (fi.Permissions & 0xf000) == 0xa000;
}

Assistant:

bool FileInfo::isLink( const std::string& filePath ) {
	FileInfo fi( filePath, true );
	return fi.isLink();
}